

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spline.cpp
# Opt level: O2

VectorNd * __thiscall
UnitBoundedPolynomial<5U,_3U>::derivative
          (VectorNd *__return_storage_ptr__,UnitBoundedPolynomial<5U,_3U> *this,double t)

{
  Scalar *pSVar1;
  int k;
  long index;
  double dVar2;
  
  for (index = 0; index != 3; index = index + 1) {
    dVar2 = UnitBoundedPolynomial1<5U>::derivative(this->_dims,t);
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        __return_storage_ptr__,index);
    *pSVar1 = dVar2;
    this = (UnitBoundedPolynomial<5U,_3U> *)(this->_dims + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

typename UnitBoundedPolynomial<Order, Dims>::VectorNd UnitBoundedPolynomial<Order, Dims>::derivative(double t) const
{
    VectorNd d;

    for (int k = 0; k < Dims; ++k)
    {
        d[k] = _dims[k].derivative(t);
    }

    return d;
}